

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

_Bool duckdb_je_pac_init(tsdn_t *tsdn,pac_t *pac,base_t *base,emap_t *emap,
                        edata_cache_t *edata_cache,nstime_t *cur_time,size_t pac_oversize_threshold,
                        ssize_t dirty_decay_ms,ssize_t muzzy_decay_ms,pac_stats_t *pac_stats,
                        malloc_mutex_t *stats_mtx)

{
  uint ind;
  _Bool _Var1;
  _Bool _Var2;
  
  ind = (base->ehooks).ind;
  _Var1 = duckdb_je_ecache_init(tsdn,&pac->ecache_dirty,extent_state_dirty,ind,true);
  _Var2 = true;
  if (!_Var1) {
    _Var1 = duckdb_je_ecache_init(tsdn,&pac->ecache_muzzy,extent_state_muzzy,ind,false);
    if (!_Var1) {
      _Var1 = duckdb_je_ecache_init(tsdn,&pac->ecache_retained,extent_state_retained,ind,false);
      if (!_Var1) {
        duckdb_je_exp_grow_init(&pac->exp_grow);
        _Var1 = duckdb_je_malloc_mutex_init
                          (&pac->grow_mtx,"extent_grow",WITNESS_RANK_EXTENT_GROW,
                           malloc_mutex_rank_exclusive);
        if (!_Var1) {
          (pac->duckdb_je_oversize_threshold).repr = pac_oversize_threshold;
          _Var1 = duckdb_je_decay_init(&pac->decay_dirty,cur_time,dirty_decay_ms);
          if (!_Var1) {
            _Var1 = duckdb_je_decay_init(&pac->decay_muzzy,cur_time,muzzy_decay_ms);
            if (!_Var1) {
              _Var1 = duckdb_je_malloc_mutex_init
                                (&(pac->sba).mtx,"sanitizer_bump_allocator",WITNESS_RANK_EXTENT_GROW
                                 ,malloc_mutex_rank_exclusive);
              if (!_Var1) {
                (pac->sba).curr_reg = (edata_t *)0x0;
                pac->base = base;
                pac->emap = emap;
                pac->edata_cache = edata_cache;
                pac->stats = pac_stats;
                pac->stats_mtx = stats_mtx;
                (pac->duckdb_je_extent_sn_next).repr = 0;
                (pac->pai).alloc = pac_alloc_impl;
                (pac->pai).alloc_batch = duckdb_je_pai_alloc_batch_default;
                (pac->pai).expand = pac_expand_impl;
                (pac->pai).shrink = pac_shrink_impl;
                (pac->pai).dalloc = pac_dalloc_impl;
                (pac->pai).dalloc_batch = duckdb_je_pai_dalloc_batch_default;
                (pac->pai).time_until_deferred_work = pac_time_until_deferred_work;
                _Var2 = false;
              }
            }
          }
        }
      }
    }
  }
  return _Var2;
}

Assistant:

bool
pac_init(tsdn_t *tsdn, pac_t *pac, base_t *base, emap_t *emap,
    edata_cache_t *edata_cache, nstime_t *cur_time,
    size_t pac_oversize_threshold, ssize_t dirty_decay_ms,
    ssize_t muzzy_decay_ms, pac_stats_t *pac_stats, malloc_mutex_t *stats_mtx) {
	unsigned ind = base_ind_get(base);
	/*
	 * Delay coalescing for dirty extents despite the disruptive effect on
	 * memory layout for best-fit extent allocation, since cached extents
	 * are likely to be reused soon after deallocation, and the cost of
	 * merging/splitting extents is non-trivial.
	 */
	if (ecache_init(tsdn, &pac->ecache_dirty, extent_state_dirty, ind,
	    /* delay_coalesce */ true)) {
		return true;
	}
	/*
	 * Coalesce muzzy extents immediately, because operations on them are in
	 * the critical path much less often than for dirty extents.
	 */
	if (ecache_init(tsdn, &pac->ecache_muzzy, extent_state_muzzy, ind,
	    /* delay_coalesce */ false)) {
		return true;
	}
	/*
	 * Coalesce retained extents immediately, in part because they will
	 * never be evicted (and therefore there's no opportunity for delayed
	 * coalescing), but also because operations on retained extents are not
	 * in the critical path.
	 */
	if (ecache_init(tsdn, &pac->ecache_retained, extent_state_retained,
	    ind, /* delay_coalesce */ false)) {
		return true;
	}
	exp_grow_init(&pac->exp_grow);
	if (malloc_mutex_init(&pac->grow_mtx, "extent_grow",
	    WITNESS_RANK_EXTENT_GROW, malloc_mutex_rank_exclusive)) {
		return true;
	}
	atomic_store_zu(&pac->oversize_threshold, pac_oversize_threshold,
	    ATOMIC_RELAXED);
	if (decay_init(&pac->decay_dirty, cur_time, dirty_decay_ms)) {
		return true;
	}
	if (decay_init(&pac->decay_muzzy, cur_time, muzzy_decay_ms)) {
		return true;
	}
	if (san_bump_alloc_init(&pac->sba)) {
		return true;
	}

	pac->base = base;
	pac->emap = emap;
	pac->edata_cache = edata_cache;
	pac->stats = pac_stats;
	pac->stats_mtx = stats_mtx;
	atomic_store_zu(&pac->extent_sn_next, 0, ATOMIC_RELAXED);

	pac->pai.alloc = &pac_alloc_impl;
	pac->pai.alloc_batch = &pai_alloc_batch_default;
	pac->pai.expand = &pac_expand_impl;
	pac->pai.shrink = &pac_shrink_impl;
	pac->pai.dalloc = &pac_dalloc_impl;
	pac->pai.dalloc_batch = &pai_dalloc_batch_default;
	pac->pai.time_until_deferred_work = &pac_time_until_deferred_work;

	return false;
}